

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrinsic_geometry_interface.cpp
# Opt level: O2

void __thiscall
geometrycentral::surface::IntrinsicGeometryInterface::computeFaceAreas
          (IntrinsicGeometryInterface *this)

{
  ulong uVar1;
  pointer puVar2;
  pointer puVar3;
  double *pdVar4;
  double dVar5;
  runtime_error *this_00;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  allocator local_161;
  RangeIteratorBase<geometrycentral::surface::FaceRangeF> __begin2;
  string local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  RangeIteratorBase<geometrycentral::surface::FaceRangeF> __end2;
  MeshData<geometrycentral::surface::Face,_double> local_70;
  RangeSetBase<geometrycentral::surface::FaceRangeF> local_38;
  
  DependentQuantity::ensureHave(&(this->edgeLengthsQ).super_DependentQuantity);
  MeshData<geometrycentral::surface::Face,_double>::MeshData
            (&local_70,(this->super_BaseGeometryInterface).mesh);
  MeshData<geometrycentral::surface::Face,_double>::operator=(&this->faceAreas,&local_70);
  MeshData<geometrycentral::surface::Face,_double>::~MeshData(&local_70);
  local_38.mesh = (this->super_BaseGeometryInterface).mesh;
  local_38.iEnd = (local_38.mesh)->nFacesFillCount;
  local_38.iStart = 0;
  RangeSetBase<geometrycentral::surface::FaceRangeF>::begin(&__begin2,&local_38);
  RangeSetBase<geometrycentral::surface::FaceRangeF>::end(&__end2,&local_38);
  while( true ) {
    if (__begin2.iCurr == __end2.iCurr) {
      return;
    }
    uVar1 = ((__begin2.mesh)->fHalfedgeArr).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[__begin2.iCurr];
    if ((__begin2.mesh)->useImplicitTwinFlag == true) {
      uVar6 = uVar1 >> 1;
    }
    else {
      uVar6 = ((__begin2.mesh)->heEdgeArr).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[uVar1];
    }
    puVar2 = ((__begin2.mesh)->heNextArr).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar7 = puVar2[uVar1];
    if ((__begin2.mesh)->useImplicitTwinFlag == false) {
      puVar3 = ((__begin2.mesh)->heEdgeArr).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar9 = puVar2[uVar7];
      uVar7 = puVar3[uVar7];
      uVar8 = puVar3[uVar9];
    }
    else {
      uVar9 = puVar2[uVar7];
      uVar7 = uVar7 >> 1;
      uVar8 = uVar9 >> 1;
    }
    if (puVar2[uVar9] != uVar1) break;
    pdVar4 = (this->edgeLengths).data.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
             .m_storage.m_data;
    dVar5 = (pdVar4[uVar6] + pdVar4[uVar7] + pdVar4[uVar8]) * 0.5;
    auVar10._8_8_ = 0;
    auVar10._0_8_ =
         (dVar5 - pdVar4[uVar8]) * (dVar5 - pdVar4[uVar7]) * dVar5 * (dVar5 - pdVar4[uVar6]);
    auVar10 = vmaxsd_avx(auVar10,ZEXT816(0));
    auVar10 = vsqrtsd_avx(auVar10,auVar10);
    (this->faceAreas).data.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
    m_data[__begin2.iCurr] = auVar10._0_8_;
    RangeIteratorBase<geometrycentral::surface::FaceRangeF>::operator++(&__begin2);
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_128,
             "/workspace/llm4binary/github/license_c_cmakelists/nmwsharp[P]gc-polyscope-project-template/deps/geometry-central/src/surface/intrinsic_geometry_interface.cpp"
             ,&local_161);
  ::std::operator+(&local_108,"GC_SAFETY_ASSERT FAILURE from ",&local_128);
  ::std::operator+(&local_e8,&local_108,":");
  ::std::__cxx11::to_string(&local_148,0x4a);
  ::std::operator+(&local_c8,&local_e8,&local_148);
  ::std::operator+(&local_a8,&local_c8," - ");
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_70,
                   &local_a8,"faces must be triangular");
  ::std::runtime_error::runtime_error(this_00,(string *)&local_70);
  __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void IntrinsicGeometryInterface::computeFaceAreas() {
  edgeLengthsQ.ensureHave();

  // ONEDAY try these for better accuracy in near-degenerate triangles?
  // "Miscalculating Area and Angles of a Needle-like Triangle" https://www.cs.unc.edu/~snoeyink/c/c205/Triangle.pdf

  faceAreas = FaceData<double>(mesh);
  for (Face f : mesh.faces()) {
    // WARNING: Logic duplicated between cached and immediate version

    Halfedge he = f.halfedge();
    double a = edgeLengths[he.edge()];
    he = he.next();
    double b = edgeLengths[he.edge()];
    he = he.next();
    double c = edgeLengths[he.edge()];

    GC_SAFETY_ASSERT(he.next() == f.halfedge(), "faces must be triangular");

    // Herons formula
    double s = (a + b + c) / 2.0;
    double arg = s * (s - a) * (s - b) * (s - c);
    arg = std::fmax(0., arg);
    double area = std::sqrt(arg);

    faceAreas[f] = area;
  }
}